

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O1

LinkedSymbol __thiscall
HuffmanTable::getLeastWeightLinkedSymbol
          (HuffmanTable *this,vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *symbols)

{
  pointer *ppLVar1;
  pointer pLVar2;
  pointer pLVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  pointer __src;
  Symbol **ppSVar8;
  Symbol *pSVar9;
  LinkedSymbol LVar10;
  
  pLVar2 = (symbols->super__Vector_base<LinkedSymbol,_std::allocator<LinkedSymbol>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (symbols->super__Vector_base<LinkedSymbol,_std::allocator<LinkedSymbol>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)pLVar3 - (long)pLVar2 >> 4;
  uVar4 = uVar5 - 1;
  uVar6 = pLVar2[uVar4].weight;
  pSVar9 = pLVar2[uVar4].symbol;
  if (pLVar3 != pLVar2) {
    uVar7 = uVar5 - 1;
    ppSVar8 = &pLVar2[uVar5 - 1].symbol;
    do {
      if (((LinkedSymbol *)(ppSVar8 + -1))->weight < uVar6) {
        pSVar9 = *ppSVar8;
        uVar4 = uVar7;
        uVar6 = ((LinkedSymbol *)(ppSVar8 + -1))->weight;
      }
      uVar7 = uVar7 - 1;
      ppSVar8 = ppSVar8 + -2;
    } while (uVar7 < uVar5);
  }
  __src = pLVar2 + uVar4 + 1;
  if (__src != pLVar3) {
    memmove(pLVar2 + uVar4,__src,(long)pLVar3 - (long)__src);
  }
  ppLVar1 = &(symbols->super__Vector_base<LinkedSymbol,_std::allocator<LinkedSymbol>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppLVar1 = *ppLVar1 + -1;
  LVar10._4_4_ = 0;
  LVar10.weight = uVar6;
  LVar10.symbol = pSVar9;
  return LVar10;
}

Assistant:

LinkedSymbol getLeastWeightLinkedSymbol(std::vector<LinkedSymbol>& symbols) {
            std::vector<LinkedSymbol>::size_type index = symbols.size() - 1;
            auto minWeight = symbols[index];
            //从底部开始循环
            for(auto i = symbols.size() - 1; i < symbols.size(); i--) {
                if(symbols[i].weight >= minWeight.weight) continue;
                minWeight = symbols[i];
                index = i;
            }
            symbols.erase(symbols.begin() + index);
            return minWeight;
    }